

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BindTargetListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BindTargetListSyntax,slang::syntax::BindTargetListSyntax_const&>
          (BumpAllocator *this,BindTargetListSyntax *args)

{
  BindTargetListSyntax *pBVar1;
  BindTargetListSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pBVar1 = (BindTargetListSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::BindTargetListSyntax::BindTargetListSyntax(in_RSI,pBVar1);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }